

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateDictionary::DumpToString(TemplateDictionary *this,string *out,int indent)

{
  undefined1 local_38 [8];
  DictionaryPrinter printer;
  int indent_local;
  string *out_local;
  TemplateDictionary *this_local;
  
  printer.writer_._20_4_ = indent;
  DictionaryPrinter::DictionaryPrinter((DictionaryPrinter *)local_38,out,indent);
  DictionaryPrinter::DumpToString((DictionaryPrinter *)local_38,this);
  DictionaryPrinter::~DictionaryPrinter((DictionaryPrinter *)local_38);
  return;
}

Assistant:

void TemplateDictionary::DumpToString(string* out, int indent) const {
  DictionaryPrinter printer(out, indent);
  printer.DumpToString(*this);
}